

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_tests.cpp
# Opt level: O0

void __thiscall
sync_tests::inconsistent_lock_order_detected::test_method(inconsistent_lock_order_detected *this)

{
  long lVar1;
  long in_FS_OFFSET;
  Mutex mutex2;
  Mutex mutex1;
  RecursiveMutex rmutex2;
  RecursiveMutex rmutex1;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff18;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff78;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::recursive_mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  AnnotatedMixin<std::recursive_mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  ::(anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff80,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff78);
  ::(anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff80,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff78);
  AnnotatedMixin<std::mutex>::AnnotatedMixin(in_stack_ffffffffffffff18);
  AnnotatedMixin<std::mutex>::AnnotatedMixin(in_stack_ffffffffffffff18);
  ::(anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::mutex>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ::(anonymous_namespace)::TestInconsistentLockOrderDetected<AnnotatedMixin<std::mutex>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(in_stack_ffffffffffffff18);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin(in_stack_ffffffffffffff18);
  AnnotatedMixin<std::recursive_mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  AnnotatedMixin<std::recursive_mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(inconsistent_lock_order_detected)
{
#ifdef DEBUG_LOCKORDER
    bool prev = g_debug_lockorder_abort;
    g_debug_lockorder_abort = false;
#endif // DEBUG_LOCKORDER

    RecursiveMutex rmutex1, rmutex2;
    TestInconsistentLockOrderDetected(rmutex1, rmutex2);
    // By checking lock order consistency (CheckLastCritical) before any unlocking (LeaveCritical)
    // the lock tracking data must not have been broken by exception.
    TestInconsistentLockOrderDetected(rmutex1, rmutex2);

    Mutex mutex1, mutex2;
    TestInconsistentLockOrderDetected(mutex1, mutex2);
    // By checking lock order consistency (CheckLastCritical) before any unlocking (LeaveCritical)
    // the lock tracking data must not have been broken by exception.
    TestInconsistentLockOrderDetected(mutex1, mutex2);

#ifdef DEBUG_LOCKORDER
    g_debug_lockorder_abort = prev;
#endif // DEBUG_LOCKORDER
}